

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

int testTerritories(void)

{
  int iVar1;
  Territory TVar2;
  char *pcVar3;
  int local_1c;
  int i;
  int nr;
  int nrTests;
  char nam [8];
  
  i = 0;
  for (local_1c = 0; local_1c < 0x3c4; local_1c = local_1c + 1) {
    iVar1 = testTerritory(TEST_TERRITORIES[local_1c].codeISO,TEST_TERRITORIES[local_1c].territory,
                          TEST_TERRITORIES[local_1c].isAlias,TEST_TERRITORIES[local_1c].needsParent,
                          TEST_TERRITORIES[local_1c].parent);
    i = iVar1 + i;
  }
  pcVar3 = getTerritoryIsoName((char *)&nr,TERRITORY_NONE,0);
  if ((((*pcVar3 != '\0') ||
       (pcVar3 = getTerritoryIsoName((char *)&nr,TERRITORY_UNKNOWN,0), *pcVar3 != '\0')) ||
      (pcVar3 = getTerritoryIsoName((char *)&nr,_TERRITORY_MIN,0), *pcVar3 != '\0')) ||
     (pcVar3 = getTerritoryIsoName((char *)&nr,_TERRITORY_MAX,0), *pcVar3 != '\0')) {
    foundError();
    printf("*** ERROR *** getTerritoryIsoName returned nonempty for bad arguments\n");
  }
  TVar2 = getTerritoryCode((char *)0x0,TERRITORY_VAT);
  if (TVar2 != TERRITORY_NONE) {
    foundError();
    printf("*** ERROR *** unexpected getTerritoryCode return for bad arguments\n");
  }
  pcVar3 = getTerritoryIsoName((char *)&nr,TERRITORY_US_CA,1);
  iVar1 = strcmp(pcVar3,"CA");
  if (iVar1 == 0) {
    pcVar3 = getTerritoryIsoName((char *)&nr,TERRITORY_IN_DD,1);
    iVar1 = strcmp(pcVar3,"DD");
    if (iVar1 == 0) {
      pcVar3 = getTerritoryIsoName((char *)&nr,TERRITORY_NLD,1);
      iVar1 = strcmp(pcVar3,"NLD");
      if (iVar1 == 0) {
        pcVar3 = getTerritoryIsoName((char *)&nr,TERRITORY_USA,1);
        iVar1 = strcmp(pcVar3,"USA");
        if (iVar1 == 0) {
          return i + 3;
        }
      }
    }
  }
  foundError();
  printf("*** ERROR *** getTerritoryIsoName returned bad short versions\n");
  return i + 3;
}

Assistant:

static int testTerritories() {
    char nam[MAX_ISOCODE_ASCII_LEN + 1];
    int nrTests = 0;
    int nr = sizeof(TEST_TERRITORIES) / sizeof(TEST_TERRITORIES[0]);
    int i;
    for (i = 0; i < nr; ++i) {
        nrTests += testTerritory(TEST_TERRITORIES[i].codeISO, TEST_TERRITORIES[i].territory,
                                 TEST_TERRITORIES[i].isAlias,
                                 TEST_TERRITORIES[i].needsParent, TEST_TERRITORIES[i].parent);
    }
    // test extremes
    ++nrTests;
    if (*getTerritoryIsoName(nam, TERRITORY_NONE, 0) || *getTerritoryIsoName(nam, TERRITORY_UNKNOWN, 0) ||
        *getTerritoryIsoName(nam, _TERRITORY_MIN, 0) || *getTerritoryIsoName(nam, _TERRITORY_MAX, 0)) {
        foundError();
        printf("*** ERROR *** getTerritoryIsoName returned nonempty for bad arguments\n");
    }
    ++nrTests;
    if (getTerritoryCode(NULL, TERRITORY_VAT) != TERRITORY_NONE) {
        foundError();
        printf("*** ERROR *** unexpected getTerritoryCode return for bad arguments\n");
    }
    // test some short values
    ++nrTests;
    if (strcmp(getTerritoryIsoName(nam, TERRITORY_US_CA, 1), "CA") ||
        strcmp(getTerritoryIsoName(nam, TERRITORY_IN_DD, 1), "DD") ||
        strcmp(getTerritoryIsoName(nam, TERRITORY_NLD, 1), "NLD") ||
        strcmp(getTerritoryIsoName(nam, TERRITORY_USA, 1), "USA")) {
        foundError();
        printf("*** ERROR *** getTerritoryIsoName returned bad short versions\n");
    }

    return nrTests;
}